

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int64_t socket_server_send(socket_server *ss,int id,void *buffer,int sz)

{
  undefined1 local_240 [8];
  request_package request;
  socket *s;
  int sz_local;
  void *buffer_local;
  int id_local;
  socket_server *ss_local;
  
  request.dummy._248_8_ = ss->slot + (id & 0xffff);
  if ((((socket *)request.dummy._248_8_)->id == id) &&
     (((socket *)request.dummy._248_8_)->type != 0)) {
    request.header._0_4_ = id;
    request.header._4_4_ = sz;
    request.u._0_8_ = buffer;
    send_request(ss,(request_package *)local_240,'D',0x10);
    ss_local = *(socket_server **)(request.dummy._248_8_ + 0x28);
  }
  else {
    free_buffer(ss,buffer,sz);
    ss_local = (socket_server *)0xffffffffffffffff;
  }
  return (int64_t)ss_local;
}

Assistant:

int64_t 
socket_server_send(struct socket_server *ss, int id, const void * buffer, int sz) {
	struct socket * s = &ss->slot[HASH_ID(id)];
	if (s->id != id || s->type == SOCKET_TYPE_INVALID) {
		free_buffer(ss, buffer, sz);
		return -1;
	}

	struct request_package request;
	request.u.send.id = id;
	request.u.send.sz = sz;
	request.u.send.buffer = (char *)buffer;

	send_request(ss, &request, 'D', sizeof(request.u.send));
	return s->wb_size;
}